

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

void link_frame_received(void *context,AMQP_VALUE performative,uint32_t payload_size,
                        uchar *payload_bytes)

{
  _Bool _Var1;
  int iVar2;
  AMQP_VALUE pAVar3;
  LOGGER_LOG p_Var4;
  code *pcVar5;
  void *pvVar6;
  LIST_ITEM_HANDLE item_handle;
  LIST_ITEM_HANDLE pLVar7;
  ASYNC_OPERATION_HANDLE async_operation;
  uint uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *pcVar11;
  ulong __n;
  ATTACH_HANDLE attach_handle;
  _Bool settled;
  delivery_number rcv_delivery_count;
  uint32_t rcv_link_credit;
  delivery_number last;
  ATTACH_HANDLE local_50;
  _Bool local_41;
  AMQP_VALUE local_40;
  uint local_38;
  uint local_34;
  
  __n = (ulong)payload_size;
  pAVar3 = amqpvalue_get_inplace_descriptor(performative);
  _Var1 = is_attach_type_by_descriptor(pAVar3);
  if (_Var1) {
    iVar2 = amqpvalue_get_attach(performative,&local_50);
    if (iVar2 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar11 = "Cannot get attach performative";
      iVar2 = 0x148;
      goto LAB_00168866;
    }
    if ((*(char *)((long)context + 0x44) == '\x01') &&
       (iVar2 = attach_get_initial_delivery_count(local_50,(sequence_no *)((long)context + 0x40)),
       iVar2 != 0)) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_frame_received",0x14f,1,"Cannot get initial delivery count");
      }
      remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
      iVar2 = *(int *)((long)context + 8);
      *(int *)((long)context + 0xc) = iVar2;
      *(undefined4 *)((long)context + 8) = 1;
      pcVar5 = *(code **)((long)context + 0x48);
      if (pcVar5 == (code *)0x0) goto LAB_001688ca;
      uVar10 = *(undefined8 *)((long)context + 0x60);
      uVar9 = 1;
    }
    else {
      iVar2 = attach_get_max_message_size(local_50,(uint64_t *)((long)context + 0x78));
      if ((iVar2 != 0) && (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0)) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_frame_received",0x157,1,
                  "Could not retrieve peer_max_message_size from attach frame");
      }
      iVar2 = *(int *)((long)context + 8);
      if (1 < iVar2 - 1U) goto LAB_001688ca;
      if (*(char *)((long)context + 0x44) == '\x01') {
        *(undefined4 *)((long)context + 0x80) = *(undefined4 *)((long)context + 0x84);
        send_flow((LINK_INSTANCE *)context);
        iVar2 = *(int *)((long)context + 8);
      }
      else {
        *(undefined4 *)((long)context + 0x80) = 0;
      }
      if (iVar2 == 1) {
        *(undefined8 *)((long)context + 8) = 0x100000003;
        pcVar5 = *(code **)((long)context + 0x48);
        if (pcVar5 == (code *)0x0) goto LAB_001688ca;
        uVar10 = *(undefined8 *)((long)context + 0x60);
        uVar9 = 3;
        iVar2 = 1;
      }
      else {
        *(int *)((long)context + 0xc) = iVar2;
        *(undefined4 *)((long)context + 8) = 4;
        pcVar5 = *(code **)((long)context + 0x48);
        if (pcVar5 == (code *)0x0) goto LAB_001688ca;
        uVar10 = *(undefined8 *)((long)context + 0x60);
        uVar9 = 4;
      }
    }
    (*pcVar5)(uVar10,uVar9,iVar2);
LAB_001688ca:
    attach_destroy(local_50);
    return;
  }
  _Var1 = is_flow_type_by_descriptor(pAVar3);
  if (_Var1) {
    iVar2 = amqpvalue_get_flow(performative,(FLOW_HANDLE *)&local_50);
    if (iVar2 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar11 = "Cannot get flow performative";
      iVar2 = 0x17a;
      goto LAB_00168866;
    }
    if (*(char *)((long)context + 0x44) != '\0') goto LAB_00168a39;
    iVar2 = flow_get_link_credit((FLOW_HANDLE)local_50,&local_38);
    if (iVar2 == 0) {
      iVar2 = flow_get_delivery_count((FLOW_HANDLE)local_50,(sequence_no *)&local_40);
      if (iVar2 == 0) {
        iVar2 = (local_38 + (int)local_40) - *(int *)((long)context + 0x40);
        *(int *)((long)context + 0x80) = iVar2;
        if (iVar2 != 0) {
          (**(code **)((long)context + 0x50))(*(undefined8 *)((long)context + 0x60));
        }
        goto LAB_00168a39;
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar11 = "Cannot get delivery count";
        iVar2 = 0x18b;
        goto LAB_00168a00;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar11 = "Cannot get link credit";
        iVar2 = 0x185;
LAB_00168a00:
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_frame_received",iVar2,1,pcVar11);
      }
    }
    remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
    *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 8);
    *(undefined4 *)((long)context + 8) = 1;
    if (*(code **)((long)context + 0x48) != (code *)0x0) {
      (**(code **)((long)context + 0x48))(*(undefined8 *)((long)context + 0x60),1);
    }
LAB_00168a39:
    flow_destroy((FLOW_HANDLE)local_50);
    return;
  }
  _Var1 = is_transfer_type_by_descriptor(pAVar3);
  if (!_Var1) {
    _Var1 = is_disposition_type_by_descriptor(pAVar3);
    if (_Var1) {
      iVar2 = amqpvalue_get_disposition(performative,(DISPOSITION_HANDLE *)&local_50);
      if (iVar2 == 0) {
        iVar2 = disposition_get_first((DISPOSITION_HANDLE)local_50,&local_38);
        if (iVar2 == 0) {
          iVar2 = disposition_get_last((DISPOSITION_HANDLE)local_50,&local_34);
          if (iVar2 != 0) {
            local_34 = local_38;
          }
          iVar2 = disposition_get_settled((DISPOSITION_HANDLE)local_50,&local_41);
          if ((((iVar2 == 0) && ((local_41 & 1U) != 0)) &&
              (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x38) != (SINGLYLINKEDLIST_HANDLE)0x0))
             && (item_handle = singlylinkedlist_get_head_item
                                         (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x38)),
                item_handle != (LIST_ITEM_HANDLE)0x0)) {
            do {
              pLVar7 = singlylinkedlist_get_next_item(item_handle);
              async_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(item_handle)
              ;
              if (async_operation == (ASYNC_OPERATION_HANDLE)0x0) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  pcVar11 = "Cannot obtain pending delivery";
                  iVar2 = 0x228;
                  goto LAB_001689b0;
                }
                break;
              }
              if ((local_38 <= *(uint *)&async_operation[1].async_operation_cancel_handler) &&
                 (*(uint *)&async_operation[1].async_operation_cancel_handler <= local_34)) {
                iVar2 = disposition_get_state((DISPOSITION_HANDLE)local_50,&local_40);
                if (iVar2 == 0) {
                  (*async_operation[2].async_operation_cancel_handler)
                            ((ASYNC_OPERATION_HANDLE)
                             async_operation[3].async_operation_cancel_handler);
                  async_operation_destroy(async_operation);
                }
                else {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                              ,"link_frame_received",0x239,1,"Failed getting the disposition state")
                    ;
                  }
                }
                iVar2 = singlylinkedlist_remove
                                  (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x38),item_handle);
                if (iVar2 != 0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    pcVar11 = "Cannot remove pending delivery";
                    iVar2 = 0x23e;
                    goto LAB_001689b0;
                  }
                  break;
                }
              }
              item_handle = pLVar7;
            } while (pLVar7 != (LIST_ITEM_HANDLE)0x0);
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar11 = "Cannot get first field";
            iVar2 = 0x20e;
LAB_001689b0:
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                      ,"link_frame_received",iVar2,1,pcVar11);
          }
        }
        disposition_destroy((DISPOSITION_HANDLE)local_50);
        return;
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar11 = "Cannot get disposition performative";
      iVar2 = 0x205;
LAB_00168866:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"link_frame_received",iVar2,1,pcVar11);
      return;
    }
    _Var1 = is_detach_type_by_descriptor(pAVar3);
    if (!_Var1) {
      return;
    }
    iVar2 = amqpvalue_get_detach(performative,(DETACH_HANDLE *)&local_50);
    if (iVar2 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar11 = "Cannot get detach performative";
      iVar2 = 0x253;
      goto LAB_00168866;
    }
    local_38 = local_38 & 0xffffff00;
    detach_get_closed((DETACH_HANDLE)local_50,(_Bool *)&local_38);
    if (*(uint *)((long)context + 8) == 4) {
      iVar2 = send_detach((LINK_INSTANCE *)context,local_38._0_1_,(ERROR_HANDLE)0x0);
      if ((iVar2 == 0) || (p_Var4 = xlogging_get_log_function(), p_Var4 == (LOGGER_LOG)0x0))
      goto LAB_00168dea;
      iVar2 = 0x262;
    }
    else {
      if (((*(uint *)((long)context + 8) & 0xfffffffe) != 2 || local_38._0_1_ != true) ||
         (*(char *)((long)context + 0x99) != '\0')) goto LAB_00168dea;
      iVar2 = send_attach((LINK_INSTANCE *)context,*(char **)((long)context + 0x30),
                          (uint)*(byte *)((long)context + 0x44),false);
      if ((iVar2 != 0) && (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0)) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_frame_received",0x26e,1,"Failed sending attach frame");
      }
      iVar2 = send_detach((LINK_INSTANCE *)context,true,(ERROR_HANDLE)0x0);
      if ((iVar2 == 0) || (p_Var4 = xlogging_get_log_function(), p_Var4 == (LOGGER_LOG)0x0))
      goto LAB_00168dea;
      iVar2 = 0x273;
    }
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
              ,"link_frame_received",iVar2,1,"Failed sending detach frame");
LAB_00168dea:
    iVar2 = detach_get_error((DETACH_HANDLE)local_50,(ERROR_HANDLE *)&local_40);
    if (iVar2 != 0) {
      local_40 = (AMQP_VALUE)0x0;
    }
    remove_all_pending_deliveries((LINK_INSTANCE *)context,true);
    if (*(code **)((long)context + 0xb8) != (code *)0x0) {
      (**(code **)((long)context + 0xb8))(*(undefined8 *)((long)context + 0xc0),local_40);
    }
    *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 8);
    if (local_40 == (AMQP_VALUE)0x0) {
      *(undefined4 *)((long)context + 8) = 1;
      if (*(code **)((long)context + 0x48) != (code *)0x0) {
        (**(code **)((long)context + 0x48))(*(undefined8 *)((long)context + 0x60),1);
      }
    }
    else {
      *(undefined4 *)((long)context + 8) = 5;
      if (*(code **)((long)context + 0x48) != (code *)0x0) {
        (**(code **)((long)context + 0x48))(*(undefined8 *)((long)context + 0x60),5);
      }
      error_destroy((ERROR_HANDLE)local_40);
    }
    detach_destroy((DETACH_HANDLE)local_50);
    return;
  }
  if (*(long *)((long)context + 0x58) == 0) {
    return;
  }
  iVar2 = amqpvalue_get_transfer(performative,(TRANSFER_HANDLE *)&local_50);
  if (iVar2 != 0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar11 = "Cannot get transfer performative";
    iVar2 = 0x1a3;
    goto LAB_00168866;
  }
  if (*(uint *)((long)context + 0x80) < 2) {
    *(undefined4 *)((long)context + 0x80) = *(undefined4 *)((long)context + 0x84);
    send_flow((LINK_INSTANCE *)context);
  }
  local_40 = (AMQP_VALUE)((ulong)local_40 & 0xffffffffffffff00);
  transfer_get_more((TRANSFER_HANDLE)local_50,(_Bool *)&local_40);
  iVar2 = transfer_get_delivery_id
                    ((TRANSFER_HANDLE)local_50,(delivery_number *)((long)context + 0xac));
  uVar8 = *(uint *)((long)context + 0xa8);
  if (iVar2 == 0) {
    if (uVar8 != 0) goto LAB_00168ad0;
    uVar8 = 0;
    if ((char)local_40 == '\x01') goto LAB_00168ad0;
  }
  else {
    if (uVar8 == 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_frame_received",0x1bb,1,
                  "Could not get the delivery Id from the transfer performative");
      }
      goto LAB_00168d32;
    }
LAB_00168ad0:
    pvVar6 = realloc(*(void **)((long)context + 0xa0),uVar8 + __n);
    if (pvVar6 == (void *)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_frame_received",0x1ca,1,
                  "Could not allocate memory for the received payload, size:%zu",uVar8 + __n);
      }
    }
    else {
      *(void **)((long)context + 0xa0) = pvVar6;
      uVar8 = *(uint *)((long)context + 0xa8);
      memcpy((void *)((long)pvVar6 + (ulong)uVar8),payload_bytes,__n);
      *(uint32_t *)((long)context + 0xa8) = payload_size + uVar8;
    }
  }
  if ((char)local_40 == '\0') {
    *(int *)((long)context + 0x80) = *(int *)((long)context + 0x80) + -1;
    *(int *)((long)context + 0x40) = *(int *)((long)context + 0x40) + 1;
    if (*(uint *)((long)context + 0xa8) != 0) {
      payload_bytes = *(uchar **)((long)context + 0xa0);
      __n = (ulong)*(uint *)((long)context + 0xa8);
    }
    pAVar3 = (AMQP_VALUE)
             (**(code **)((long)context + 0x58))
                       (*(undefined8 *)((long)context + 0x60),local_50,__n,payload_bytes);
    if (*(int *)((long)context + 0xa8) != 0) {
      free(*(void **)((long)context + 0xa0));
      *(undefined8 *)((long)context + 0xa0) = 0;
      *(undefined4 *)((long)context + 0xa8) = 0;
    }
    if (pAVar3 != (AMQP_VALUE)0x0) {
      iVar2 = send_disposition((LINK_INSTANCE *)context,*(delivery_number *)((long)context + 0xac),
                               pAVar3);
      if ((iVar2 != 0) && (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0)) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_frame_received",500,1,"Cannot send disposition frame");
      }
      amqpvalue_destroy(pAVar3);
    }
  }
LAB_00168d32:
  transfer_destroy((TRANSFER_HANDLE)local_50);
  return;
}

Assistant:

static void link_frame_received(void* context, AMQP_VALUE performative, uint32_t payload_size, const unsigned char* payload_bytes)
{
    LINK_INSTANCE* link_instance = (LINK_INSTANCE*)context;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);

    if (is_attach_type_by_descriptor(descriptor))
    {
        ATTACH_HANDLE attach_handle;

        if (amqpvalue_get_attach(performative, &attach_handle) != 0)
        {
            LogError("Cannot get attach performative");
        }
        else
        {
            if ((link_instance->role == role_receiver) &&
                (attach_get_initial_delivery_count(attach_handle, &link_instance->delivery_count) != 0))
            {
                LogError("Cannot get initial delivery count");
                remove_all_pending_deliveries(link_instance, true);
                set_link_state(link_instance, LINK_STATE_DETACHED);
            }
            else
            {
                if (attach_get_max_message_size(attach_handle, &link_instance->peer_max_message_size) != 0)
                {
                    LogError("Could not retrieve peer_max_message_size from attach frame");
                }

                if ((link_instance->link_state == LINK_STATE_DETACHED) ||
                    (link_instance->link_state == LINK_STATE_HALF_ATTACHED_ATTACH_SENT))
                {
                    if (link_instance->role == role_receiver)
                    {
                        link_instance->current_link_credit = link_instance->max_link_credit;
                        send_flow(link_instance);
                    }
                    else
                    {
                        link_instance->current_link_credit = 0;
                    }

                    if (link_instance->link_state == LINK_STATE_DETACHED)
                    {
                        set_link_state(link_instance, LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED);
                    }
                    else
                    {
                        set_link_state(link_instance, LINK_STATE_ATTACHED);
                    }
                }
            }

            attach_destroy(attach_handle);
        }
    }
    else if (is_flow_type_by_descriptor(descriptor))
    {
        FLOW_HANDLE flow_handle;
        if (amqpvalue_get_flow(performative, &flow_handle) != 0)
        {
            LogError("Cannot get flow performative");
        }
        else
        {
            if (link_instance->role == role_sender)
            {
                delivery_number rcv_delivery_count;
                uint32_t rcv_link_credit;

                if (flow_get_link_credit(flow_handle, &rcv_link_credit) != 0)
                {
                    LogError("Cannot get link credit");
                    remove_all_pending_deliveries(link_instance, true);
                    set_link_state(link_instance, LINK_STATE_DETACHED);
                }
                else if (flow_get_delivery_count(flow_handle, &rcv_delivery_count) != 0)
                {
                    LogError("Cannot get delivery count");
                    remove_all_pending_deliveries(link_instance, true);
                    set_link_state(link_instance, LINK_STATE_DETACHED);
                }
                else
                {
                    link_instance->current_link_credit = rcv_delivery_count + rcv_link_credit - link_instance->delivery_count;
                    if (link_instance->current_link_credit > 0)
                    {
                        link_instance->on_link_flow_on(link_instance->callback_context);
                    }
                }
            }

            flow_destroy(flow_handle);
        }
    }
    else if (is_transfer_type_by_descriptor(descriptor))
    {
        if (link_instance->on_transfer_received != NULL)
        {
            TRANSFER_HANDLE transfer_handle;
            if (amqpvalue_get_transfer(performative, &transfer_handle) != 0)
            {
                LogError("Cannot get transfer performative");
            }
            else
            {
                AMQP_VALUE delivery_state;
                bool more;
                bool is_error;

                if (link_instance->current_link_credit <= RECEIVER_MIN_LINK_CREDIT)
                {
                    link_instance->current_link_credit = link_instance->max_link_credit;
                    send_flow(link_instance);
                }

                more = false;
                /* Attempt to get more flag, default to false */
                (void)transfer_get_more(transfer_handle, &more);
                is_error = false;

                if (transfer_get_delivery_id(transfer_handle, &link_instance->received_delivery_id) != 0)
                {
                    /* is this not a continuation transfer? */
                    if (link_instance->received_payload_size == 0)
                    {
                        LogError("Could not get the delivery Id from the transfer performative");
                        is_error = true;
                    }
                }

                if (!is_error)
                {
                    /* If this is a continuation transfer or if this is the first chunk of a multi frame transfer */
                    if ((link_instance->received_payload_size > 0) || more)
                    {
                        unsigned char* new_received_payload;;
                        size_t realloc_size = safe_add_size_t((size_t)link_instance->received_payload_size, payload_size);
                        if (realloc_size == SIZE_MAX ||
                            (new_received_payload = (unsigned char*)realloc(link_instance->received_payload, realloc_size)) == NULL)
                        {
                            LogError("Could not allocate memory for the received payload, size:%zu", realloc_size);
                        }
                        else
                        {
                            link_instance->received_payload = new_received_payload;
                            (void)memcpy(link_instance->received_payload + link_instance->received_payload_size, payload_bytes, payload_size);
                            link_instance->received_payload_size += payload_size;
                        }
                    }

                    if (!more)
                    {
                        const unsigned char* indicate_payload_bytes;
                        uint32_t indicate_payload_size;

                        link_instance->current_link_credit--;
                        link_instance->delivery_count++;
                        /* if no previously stored chunks then simply report the current payload */
                        if (link_instance->received_payload_size > 0)
                        {
                            indicate_payload_size = link_instance->received_payload_size;
                            indicate_payload_bytes = link_instance->received_payload;
                        }
                        else
                        {
                            indicate_payload_size = payload_size;
                            indicate_payload_bytes = payload_bytes;
                        }

                        delivery_state = link_instance->on_transfer_received(link_instance->callback_context, transfer_handle, indicate_payload_size, indicate_payload_bytes);

                        if (link_instance->received_payload_size > 0)
                        {
                            free(link_instance->received_payload);
                            link_instance->received_payload = NULL;
                            link_instance->received_payload_size = 0;
                        }

                        if (delivery_state != NULL)
                        {
                            if (send_disposition(link_instance, link_instance->received_delivery_id, delivery_state) != 0)
                            {
                                LogError("Cannot send disposition frame");
                            }

                            amqpvalue_destroy(delivery_state);
                        }
                    }
                }

                transfer_destroy(transfer_handle);
            }
        }
    }
    else if (is_disposition_type_by_descriptor(descriptor))
    {
        DISPOSITION_HANDLE disposition;
        if (amqpvalue_get_disposition(performative, &disposition) != 0)
        {
            LogError("Cannot get disposition performative");
        }
        else
        {
            delivery_number first;
            delivery_number last;

            if (disposition_get_first(disposition, &first) != 0)
            {
                LogError("Cannot get first field");
            }
            else
            {
                bool settled;

                if (disposition_get_last(disposition, &last) != 0)
                {
                    last = first;
                }

                if (disposition_get_settled(disposition, &settled) != 0)
                {
                    settled = false;
                }

                if (settled && 
                    link_instance->pending_deliveries != NULL)
                {
                    LIST_ITEM_HANDLE pending_delivery = singlylinkedlist_get_head_item(link_instance->pending_deliveries);
                    while (pending_delivery != NULL)
                    {
                        LIST_ITEM_HANDLE next_pending_delivery = singlylinkedlist_get_next_item(pending_delivery);
                        ASYNC_OPERATION_HANDLE pending_delivery_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(pending_delivery);
                        if (pending_delivery_operation == NULL)
                        {
                            LogError("Cannot obtain pending delivery");
                            break;
                        }
                        else
                        {
                            DELIVERY_INSTANCE* delivery_instance = (DELIVERY_INSTANCE*)GET_ASYNC_OPERATION_CONTEXT(DELIVERY_INSTANCE, pending_delivery_operation);

                            if ((delivery_instance->delivery_id >= first) && (delivery_instance->delivery_id <= last))
                            {
                                AMQP_VALUE delivery_state;
                                if (disposition_get_state(disposition, &delivery_state) == 0)
                                {
                                    delivery_instance->on_delivery_settled(delivery_instance->callback_context, delivery_instance->delivery_id, LINK_DELIVERY_SETTLE_REASON_DISPOSITION_RECEIVED, delivery_state);
                                    async_operation_destroy(pending_delivery_operation);
                                }
                                else
                                {
                                    LogError("Failed getting the disposition state");
                                }

                                if (singlylinkedlist_remove(link_instance->pending_deliveries, pending_delivery) != 0)
                                {
                                    LogError("Cannot remove pending delivery");
                                    break;
                                }
                            }

                            pending_delivery = next_pending_delivery;
                        }
                    }
                }
            }

            disposition_destroy(disposition);
        }
    }
    else if (is_detach_type_by_descriptor(descriptor))
    {
        DETACH_HANDLE detach;

        /* Set link state appropriately based on whether we received detach condition */
        if (amqpvalue_get_detach(performative, &detach) != 0)
        {
            LogError("Cannot get detach performative");
        }
        else
        {
            bool closed = false;
            ERROR_HANDLE error;

            (void)detach_get_closed(detach, &closed);

            /* Received a detach while attached */
            if (link_instance->link_state == LINK_STATE_ATTACHED)
            {
                /* Respond with ack */
                if (send_detach(link_instance, closed, NULL) != 0)
                {
                    LogError("Failed sending detach frame");
                }
            }
            /* Received a closing detach after we sent a non-closing detach. */
            else if (closed &&
                ((link_instance->link_state == LINK_STATE_HALF_ATTACHED_ATTACH_SENT) || (link_instance->link_state == LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED)) &&
                !link_instance->is_closed)
            {

                /* In this case, we MUST signal that we closed by reattaching and then sending a closing detach.*/
                if (send_attach(link_instance, link_instance->name, 0, link_instance->role) != 0)
                {
                    LogError("Failed sending attach frame");
                }

                if (send_detach(link_instance, true, NULL) != 0)
                {
                    LogError("Failed sending detach frame");
                }
            }

            if (detach_get_error(detach, &error) != 0)
            {
                error = NULL;
            }
            remove_all_pending_deliveries(link_instance, true);
            // signal link detach received in order to handle cases like redirect
            if (link_instance->on_link_detach_received_event_subscription.on_link_detach_received != NULL)
            {
                link_instance->on_link_detach_received_event_subscription.on_link_detach_received(link_instance->on_link_detach_received_event_subscription.context, error);
            }

            if (error != NULL)
            {
                set_link_state(link_instance, LINK_STATE_ERROR);
                error_destroy(error);
            }
            else
            {
                set_link_state(link_instance, LINK_STATE_DETACHED);
            }

            detach_destroy(detach);
        }
    }
}